

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O0

int CfdGetSelectedCoinIndex
              (void *handle,void *coin_select_handle,uint32_t index,int32_t *utxo_index)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  size_type sVar3;
  reference pvVar4;
  value_type *in_RCX;
  uint in_EDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  CfdCapiCoinSelection *buffer;
  int result;
  size_type in_stack_fffffffffffffea8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffec0;
  CfdError in_stack_fffffffffffffecc;
  CfdException *in_stack_fffffffffffffed0;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  long local_b0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  allocator local_61;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"CoinSelection",&local_61);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (in_RCX == (value_type *)0x0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_coin.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x1f1;
    local_80.funcname = "CfdGetSelectedCoinIndex";
    cfd::core::logger::warn<>(&local_80,"utxo index is null.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. utxo index is null.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(in_RSI + 0x88) != 0) {
    local_b0 = in_RSI;
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0);
    if (!bVar1) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size
                        (*(vector<int,_std::allocator<int>_> **)(local_b0 + 0x88));
      if (in_EDX < sVar3) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::at
                           (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        *in_RCX = *pvVar4;
      }
      else {
        *in_RCX = -1;
      }
      return 0;
    }
  }
  local_c8.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_coin.cpp"
               ,0x2f);
  local_c8.filename = local_c8.filename + 1;
  local_c8.line = 0x1fa;
  local_c8.funcname = "CfdGetSelectedCoinIndex";
  cfd::core::logger::warn<>(&local_c8,"select coin list is empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"Failed to parameter. select coin list is empty.",&local_e9)
  ;
  cfd::core::CfdException::CfdException(this,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSelectedCoinIndex(
    void* handle, void* coin_select_handle, uint32_t index,
    int32_t* utxo_index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(coin_select_handle, kPrefixCoinSelection);
    if (utxo_index == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo index is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. utxo index is null.");
    }

    CfdCapiCoinSelection* buffer =
        static_cast<CfdCapiCoinSelection*>(coin_select_handle);
    if ((buffer->indexes == nullptr) || buffer->indexes->empty()) {
      warn(CFD_LOG_SOURCE, "select coin list is empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. select coin list is empty.");
    } else if (index >= buffer->indexes->size()) {
      *utxo_index = -1;
    } else {
      *utxo_index = buffer->indexes->at(index);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}